

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 gen_sub32_carry32(TCGContext_conflict8 *tcg_ctx)

{
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 cc_src2_32;
  TCGv_i32 cc_src1_32;
  TCGv_i32 carry_32;
  TCGContext_conflict8 *tcg_ctx_local;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extrl_i64_i32_sparc64(tcg_ctx,ret,tcg_ctx->cpu_cc_src);
  tcg_gen_extrl_i64_i32_sparc64(tcg_ctx,ret_00,tcg_ctx->cpu_cc_src2);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_setcond_i32_sparc64(tcg_ctx,TCG_COND_LTU,ret_01,ret,ret_00);
  tcg_temp_free_i32(tcg_ctx,ret);
  tcg_temp_free_i32(tcg_ctx,ret_00);
  return ret_01;
}

Assistant:

static TCGv_i32 gen_sub32_carry32(TCGContext *tcg_ctx)
{
    TCGv_i32 carry_32, cc_src1_32, cc_src2_32;

    /* Carry is computed from a previous borrow: (src1 < src2)  */
#if TARGET_LONG_BITS == 64
    cc_src1_32 = tcg_temp_new_i32(tcg_ctx);
    cc_src2_32 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, cc_src1_32, tcg_ctx->cpu_cc_src);
    tcg_gen_extrl_i64_i32(tcg_ctx, cc_src2_32, tcg_ctx->cpu_cc_src2);
#else
    cc_src1_32 = tcg_ctx->cpu_cc_src;
    cc_src2_32 = tcg_ctx->cpu_cc_src2;
#endif

    carry_32 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, carry_32, cc_src1_32, cc_src2_32);

#if TARGET_LONG_BITS == 64
    tcg_temp_free_i32(tcg_ctx, cc_src1_32);
    tcg_temp_free_i32(tcg_ctx, cc_src2_32);
#endif

    return carry_32;
}